

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O0

void __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::save
          (segment_impl<ELFIO::Elf32_Phdr> *this,ostream *f,streampos header_offset,
          streampos data_offset)

{
  uint32_t uVar1;
  streamoff sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  char *in_RSI;
  long in_RDI;
  fpos local_20 [16];
  undefined8 local_10;
  undefined8 local_8;
  
  local_10 = in_RDX;
  local_8 = in_RCX;
  sVar2 = std::fpos::operator_cast_to_long(local_20);
  *(int *)(in_RDI + 0x14) = (int)sVar2;
  uVar1 = endianess_convertor::operator()
                    (*(endianess_convertor **)(in_RDI + 0x58),*(uint32_t *)(in_RDI + 0x14));
  *(uint32_t *)(in_RDI + 0x14) = uVar1;
  std::ostream::seekp(in_RSI,local_10,local_8);
  std::ostream::write(in_RSI,in_RDI + 0x10);
  return;
}

Assistant:

void save( std::ostream&  f,
               std::streampos header_offset,
               std::streampos data_offset )
    {
        ph.p_offset = data_offset;
        ph.p_offset = (*convertor)(ph.p_offset);
        f.seekp( header_offset );
        f.write( reinterpret_cast<const char*>( &ph ), sizeof( ph ) );
    }